

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_sequence.cpp
# Opt level: O3

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateSequence(Transformer *this,PGCreateSeqStmt *stmt)

{
  char cVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [8];
  ValUnion VVar8;
  bool bVar9;
  OnCreateConflict OVar10;
  int iVar11;
  Transformer *pTVar12;
  __uniq_ptr_impl<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>_>
  this_00;
  pointer pCVar13;
  size_t sVar14;
  __node_base_ptr p_Var15;
  pointer pCVar16;
  ParserException *pPVar17;
  long in_RDX;
  char *__s;
  __node_base_ptr p_Var18;
  undefined1 in_R8B;
  long *plVar19;
  bool bVar20;
  bool bVar21;
  string_t input;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  optional_ptr<duckdb_libpgquery::PGValue,_true> val;
  int64_t opt_value;
  unordered_set<duckdb::SequenceInfo,_duckdb::EnumClassHash,_std::equal_to<duckdb::SequenceInfo>,_std::allocator<duckdb::SequenceInfo>_>
  used;
  string opt_name;
  QualifiedName qname;
  undefined1 local_1c1;
  undefined1 local_1c0 [8];
  undefined1 local_1b8 [32];
  __node_base local_198;
  optional_ptr<duckdb_libpgquery::PGValue,_true> local_190;
  ValUnion local_188;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> local_180;
  __node_base_ptr local_178;
  ulong local_170;
  uint local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  pointer local_130;
  _Hash_node_base _Stack_128;
  unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
  *local_120;
  pointer local_118;
  unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
  local_110 [2];
  long local_100;
  idx_t local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  QualifiedName local_90;
  
  pTVar12 = (Transformer *)operator_new(0x80);
  CreateStatement::CreateStatement((CreateStatement *)pTVar12);
  (this->parent).ptr = pTVar12;
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateSequenceInfo_*,_std::default_delete<duckdb::CreateSequenceInfo>_>
  .super__Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateSequenceInfo_*,_std::default_delete<duckdb::CreateSequenceInfo>_>)
       operator_new(0x178);
  CreateSequenceInfo::CreateSequenceInfo
            ((CreateSequenceInfo *)
             this_00._M_t.
             super__Tuple_impl<0UL,_duckdb::CreateSequenceInfo_*,_std::default_delete<duckdb::CreateSequenceInfo>_>
             .super__Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>._M_head_impl);
  local_1c0 = (undefined1  [8])
              this_00._M_t.
              super__Tuple_impl<0UL,_duckdb::CreateSequenceInfo_*,_std::default_delete<duckdb::CreateSequenceInfo>_>
              .super__Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>._M_head_impl;
  TransformQualifiedName(&local_90,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8));
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar13->super_CreateInfo).catalog);
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar13->super_CreateInfo).schema);
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar13->name);
  if (*(long *)(in_RDX + 0x10) == 0) goto LAB_00e9175d;
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  local_158._0_8_ = &_Stack_128;
  local_158._8_8_ = 1;
  local_158._16_8_ = (_Hash_node_base *)0x0;
  local_158._24_8_ = 0;
  local_138 = 1.0;
  local_130 = (pointer)0x0;
  _Stack_128._M_nxt = (_Hash_node_base *)0x0;
  plVar19 = *(long **)(*(long *)(in_RDX + 0x10) + 8);
  p_Var18 = (__node_base_ptr)pCVar13->start_value;
  if (plVar19 == (long *)0x0) {
LAB_00e91742:
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    pCVar13->start_value = (int64_t)p_Var18;
  }
  else {
    local_170 = 0;
    local_f8 = 0x8000000000000000;
    local_180._M_head_impl = (CreateStatement *)this;
    local_178 = (__node_base_ptr)pCVar13->start_value;
    local_100 = in_RDX;
    do {
      local_198._M_nxt = (_Hash_node_base *)*plVar19;
      optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGDefElem,_true> *)&local_198);
      ::std::__cxx11::string::string
                ((string *)&local_120,(char *)local_198._M_nxt[2]._M_nxt,(allocator *)local_1b8);
      optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGDefElem,_true> *)&local_198);
      local_190.ptr = (PGValue *)local_198._M_nxt[3]._M_nxt;
      optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGDefElem,_true> *)&local_198);
      bVar20 = *(int *)&local_198._M_nxt[4]._M_nxt != 0;
      local_188.ival = 0;
      bVar21 = local_190.ptr != (PGValue *)0x0;
      if (bVar21) {
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_190);
        if ((local_190.ptr)->type == 0xd9) {
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_190);
          local_188 = (local_190.ptr)->val;
        }
        else {
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_190);
          if ((local_190.ptr)->type != 0xda) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1b8._0_8_ = local_1b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Expected an integer argument for option %s","");
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_120,(long)local_118 + (long)local_120);
            ParserException::ParserException<std::__cxx11::string>
                      (pPVar17,(string *)local_1b8,&local_d0);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_190);
          __s = ((local_190.ptr)->val).str;
          sVar14 = strlen(__s);
          local_168 = (uint)sVar14;
          if (local_168 < 0xd) {
            uStack_15c = 0;
            uStack_164 = 0;
            uStack_160 = 0;
            if (local_168 == 0) {
              __s = (char *)0x0;
            }
            else {
              switchD_012b9b0d::default(&uStack_164,__s,(ulong)(local_168 & 0xf));
              __s = (char *)CONCAT44(uStack_15c,uStack_160);
            }
          }
          else {
            uStack_164 = *(undefined4 *)__s;
            uStack_160 = SUB84(__s,0);
            uStack_15c = (undefined4)((ulong)__s >> 0x20);
          }
          input.value.pointer.ptr = (char *)&local_188;
          input.value._0_8_ = __s;
          bVar9 = TryCast::Operation<duckdb::string_t,long>
                            ((TryCast *)CONCAT44(uStack_164,local_168),input,
                             (int64_t *)&DAT_00000001,(bool)in_R8B);
          if (!bVar9) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1b8._0_8_ = local_1b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Expected an integer argument for option %s","");
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_120,(long)local_118 + (long)local_120);
            ParserException::ParserException<std::__cxx11::string>
                      (pPVar17,(string *)local_1b8,&local_b0);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      iVar11 = ::std::__cxx11::string::compare((char *)&local_120);
      if (iVar11 == 0) {
        local_1b8[0] = 1;
        p_Var15 = ::std::
                  _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)local_158,(ulong)(local_158._8_8_ != 1),local_1b8,1);
        if ((p_Var15 != (__node_base_ptr)0x0) && (p_Var15->_M_nxt != (_Hash_node_base *)0x0)) {
          pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
          local_1b8._0_8_ = local_1b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"Increment value should be passed as most once","");
          ParserException::ParserException(pPVar17,(string *)local_1b8);
          __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_1c1 = 1;
        local_1b8._0_8_ =
             (_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_158;
        ::std::
        _Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::SequenceInfo,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::SequenceInfo,true>>>>
                  ((_Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_158,&local_1c1,local_1b8);
        VVar8 = local_188;
        if (bVar20 || bVar21) {
          pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                    ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                  *)local_1c0);
          pCVar13->increment = (int64_t)VVar8;
          pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                    ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                  *)local_1c0);
          if (pCVar13->increment == 0) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1b8._0_8_ = local_1b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Increment must not be zero","");
            ParserException::ParserException(pPVar17,(string *)local_1b8);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                    ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                  *)local_1c0);
          if (pCVar13->increment < 0) {
            pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                    *)local_1c0);
            pCVar13->max_value = -1;
            pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                    *)local_1c0);
            pCVar13->min_value = local_f8;
            local_178 = (__node_base_ptr)0xffffffffffffffff;
          }
          else {
            pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                    *)local_1c0);
            pCVar13->min_value = 1;
            pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                    *)local_1c0);
            pCVar13->max_value = 0x7fffffffffffffff;
            local_178 = (__node_base_ptr)&DAT_00000001;
          }
        }
      }
      else {
        iVar11 = ::std::__cxx11::string::compare((char *)&local_120);
        if (iVar11 == 0) {
          local_1b8[0] = 2;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_158._8_8_;
          p_Var15 = ::std::
                    _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::_M_find_before_node
                              ((_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)local_158,SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0),
                               local_1b8,2);
          if ((p_Var15 != (__node_base_ptr)0x0) && (p_Var15->_M_nxt != (_Hash_node_base *)0x0)) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1b8._0_8_ = local_1b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Minvalue should be passed as most once","");
            ParserException::ParserException(pPVar17,(string *)local_1b8);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_1c1 = 2;
          local_1b8._0_8_ =
               (_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_158;
          ::std::
          _Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::SequenceInfo,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::SequenceInfo,true>>>>
                    ((_Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_158,&local_1c1,local_1b8);
          VVar8 = local_188;
          if (bVar20 || bVar21) {
            pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                    *)local_1c0);
            pCVar13->min_value = (int64_t)VVar8;
            pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                    *)local_1c0);
            if (0 < pCVar13->increment) {
              pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                        ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                      *)local_1c0);
              local_178 = (__node_base_ptr)pCVar13->min_value;
            }
          }
        }
        else {
          iVar11 = ::std::__cxx11::string::compare((char *)&local_120);
          if (iVar11 == 0) {
            local_1b8[0] = 3;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_158._8_8_;
            p_Var15 = ::std::
                      _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::_M_find_before_node
                                ((_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                  *)local_158,SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0),
                                 local_1b8,3);
            if ((p_Var15 != (__node_base_ptr)0x0) && (p_Var15->_M_nxt != (_Hash_node_base *)0x0)) {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1b8._0_8_ = local_1b8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"Maxvalue should be passed as most once","");
              ParserException::ParserException(pPVar17,(string *)local_1b8);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_1c1 = 3;
            local_1b8._0_8_ =
                 (_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_158;
            ::std::
            _Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<duckdb::SequenceInfo,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::SequenceInfo,true>>>>
                      ((_Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_158,&local_1c1,local_1b8);
            VVar8 = local_188;
            if (bVar20 || bVar21) {
              pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                        ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                      *)local_1c0);
              pCVar13->max_value = (int64_t)VVar8;
              pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                        ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                      *)local_1c0);
              if (pCVar13->increment < 0) {
                pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                        *)local_1c0);
                local_178 = (__node_base_ptr)pCVar13->max_value;
              }
            }
          }
          else {
            iVar11 = ::std::__cxx11::string::compare((char *)&local_120);
            if (iVar11 == 0) {
              local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffffffffff00;
              p_Var15 = ::std::
                        _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    *)local_158,0,local_1b8,0);
              if ((p_Var15 != (__node_base_ptr)0x0) && (p_Var15->_M_nxt != (_Hash_node_base *)0x0))
              {
                pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
                local_1b8._0_8_ = local_1b8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b8,"Start value should be passed as most once","");
                ParserException::ParserException(pPVar17,(string *)local_1b8);
                __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              local_1c1 = 0;
              local_1b8._0_8_ =
                   (_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)local_158;
              ::std::
              _Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::SequenceInfo,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::SequenceInfo,true>>>>
                        ((_Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)local_158,&local_1c1,local_1b8);
              VVar8 = local_188;
              if (bVar20 || bVar21) {
                pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                        *)local_1c0);
                pCVar13->start_value = (int64_t)VVar8;
                local_170 = CONCAT71((int7)((ulong)pCVar13 >> 8),1);
              }
            }
            else {
              iVar11 = ::std::__cxx11::string::compare((char *)&local_120);
              if (iVar11 != 0) {
                pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
                local_1b8._0_8_ = local_1b8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b8,"Unrecognized option \"%s\" for CREATE SEQUENCE","");
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f0,local_120,(long)local_118 + (long)local_120);
                ParserException::ParserException<std::__cxx11::string>
                          (pPVar17,(string *)local_1b8,&local_f0);
                __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              local_1b8[0] = 4;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_158._8_8_;
              p_Var15 = ::std::
                        _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    *)local_158,SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar4,0)
                                   ,local_1b8,4);
              if ((p_Var15 != (__node_base_ptr)0x0) && (p_Var15->_M_nxt != (_Hash_node_base *)0x0))
              {
                pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
                local_1b8._0_8_ = local_1b8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b8,"Cycle value should be passed as most once","");
                ParserException::ParserException(pPVar17,(string *)local_1b8);
                __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              local_1c1 = 4;
              local_1b8._0_8_ =
                   (_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)local_158;
              ::std::
              _Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::SequenceInfo,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::SequenceInfo,true>>>>
                        ((_Hashtable<duckdb::SequenceInfo,duckdb::SequenceInfo,std::allocator<duckdb::SequenceInfo>,std::__detail::_Identity,std::equal_to<duckdb::SequenceInfo>,duckdb::EnumClassHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)local_158,&local_1c1,local_1b8);
              VVar8 = local_188;
              if (bVar20 || bVar21) {
                pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                                        *)local_1c0);
                pCVar13->cycle = 0 < VVar8.ival;
              }
            }
          }
        }
      }
      if (local_120 != local_110) {
        operator_delete(local_120);
      }
      plVar19 = (long *)plVar19[1];
    } while (plVar19 != (long *)0x0);
    p_Var18 = local_178;
    this = (Transformer *)local_180._M_head_impl;
    in_RDX = local_100;
    if ((local_170 & 1) == 0) goto LAB_00e91742;
  }
  ::std::
  _Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::SequenceInfo,_duckdb::SequenceInfo,_std::allocator<duckdb::SequenceInfo>,_std::__detail::_Identity,_std::equal_to<duckdb::SequenceInfo>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_158);
LAB_00e9175d:
  cVar1 = *(char *)(*(long *)(in_RDX + 8) + 0x21);
  pTVar12 = (Transformer *)local_1c0;
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)pTVar12);
  (pCVar13->super_CreateInfo).temporary = cVar1 == '\0';
  OVar10 = TransformOnConflict(pTVar12,*(PGOnCreateConflict *)(in_RDX + 0x20));
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  (pCVar13->super_CreateInfo).on_conflict = OVar10;
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  lVar2 = pCVar13->max_value;
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  if (lVar2 <= pCVar13->min_value) {
    pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
    local_158._0_8_ = local_158 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"MINVALUE (%lld) must be less than MAXVALUE (%lld)","");
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    lVar2 = pCVar13->min_value;
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    ParserException::ParserException<long,long>
              (pPVar17,(string *)local_158,lVar2,pCVar13->max_value);
    __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  lVar2 = pCVar13->start_value;
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  if (lVar2 < pCVar13->min_value) {
    pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
    local_158._0_8_ = local_158 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"START value (%lld) cannot be less than MINVALUE (%lld)","");
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    lVar2 = pCVar13->start_value;
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    ParserException::ParserException<long,long>
              (pPVar17,(string *)local_158,lVar2,pCVar13->min_value);
    __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  lVar2 = pCVar13->start_value;
  pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
            ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                          *)local_1c0);
  auVar7 = local_1c0;
  if (pCVar13->max_value < lVar2) {
    pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
    local_158._0_8_ = local_158 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"START value (%lld) cannot be greater than MAXVALUE (%lld)","");
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    lVar2 = pCVar13->start_value;
    pCVar13 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                            *)local_1c0);
    ParserException::ParserException<long,long>
              (pPVar17,(string *)local_158,lVar2,pCVar13->max_value);
    __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_1c0 = (undefined1  [8])0x0;
  pCVar16 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
            ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                          *)this);
  _Var3._M_head_impl =
       (pCVar16->info).
       super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (pCVar16->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)auVar7;
  if (_Var3._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
    operator_delete(local_90.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
    operator_delete(local_90.catalog._M_dataplus._M_p);
  }
  if (local_1c0 != (undefined1  [8])0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_1c0)->ptr->options)();
  }
  return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
         (__uniq_ptr_impl<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
         this;
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateSequence(duckdb_libpgquery::PGCreateSeqStmt &stmt) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateSequenceInfo>();

	auto qname = TransformQualifiedName(*stmt.sequence);
	info->catalog = qname.catalog;
	info->schema = qname.schema;
	info->name = qname.name;

	if (stmt.options) {
		int64_t default_start_value = info->start_value;
		bool has_start_value = false;
		unordered_set<SequenceInfo, EnumClassHash> used;
		duckdb_libpgquery::PGListCell *cell = nullptr;
		for_each_cell(cell, stmt.options->head) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(cell->data.ptr_value);
			string opt_name = string(def_elem->defname);
			auto val = PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg);
			bool nodef = def_elem->defaction == duckdb_libpgquery::PG_DEFELEM_UNSPEC && !val; // e.g. NO MINVALUE
			int64_t opt_value = 0;

			if (val) {
				if (val->type == duckdb_libpgquery::T_PGInteger) {
					opt_value = val->val.ival;
				} else if (val->type == duckdb_libpgquery::T_PGFloat) {
					if (!TryCast::Operation<string_t, int64_t>(string_t(val->val.str), opt_value, true)) {
						throw ParserException("Expected an integer argument for option %s", opt_name);
					}
				} else {
					throw ParserException("Expected an integer argument for option %s", opt_name);
				}
			}
			if (opt_name == "increment") {
				if (used.find(SequenceInfo::SEQ_INC) != used.end()) {
					throw ParserException("Increment value should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_INC);
				if (nodef) {
					continue;
				}

				info->increment = opt_value;
				if (info->increment == 0) {
					throw ParserException("Increment must not be zero");
				}
				if (info->increment < 0) {
					default_start_value = info->max_value = -1;
					info->min_value = NumericLimits<int64_t>::Minimum();
				} else {
					default_start_value = info->min_value = 1;
					info->max_value = NumericLimits<int64_t>::Maximum();
				}
			} else if (opt_name == "minvalue") {
				if (used.find(SequenceInfo::SEQ_MIN) != used.end()) {
					throw ParserException("Minvalue should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_MIN);
				if (nodef) {
					continue;
				}

				info->min_value = opt_value;
				if (info->increment > 0) {
					default_start_value = info->min_value;
				}
			} else if (opt_name == "maxvalue") {
				if (used.find(SequenceInfo::SEQ_MAX) != used.end()) {
					throw ParserException("Maxvalue should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_MAX);
				if (nodef) {
					continue;
				}

				info->max_value = opt_value;
				if (info->increment < 0) {
					default_start_value = info->max_value;
				}
			} else if (opt_name == "start") {
				if (used.find(SequenceInfo::SEQ_START) != used.end()) {
					throw ParserException("Start value should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_START);
				if (nodef) {
					continue;
				}
				has_start_value = true;
				info->start_value = opt_value;
			} else if (opt_name == "cycle") {
				if (used.find(SequenceInfo::SEQ_CYCLE) != used.end()) {
					throw ParserException("Cycle value should be passed as most once");
				}
				used.insert(SequenceInfo::SEQ_CYCLE);
				if (nodef) {
					continue;
				}

				info->cycle = opt_value > 0;
			} else {
				throw ParserException("Unrecognized option \"%s\" for CREATE SEQUENCE", opt_name);
			}
		}
		if (!has_start_value) {
			info->start_value = default_start_value;
		}
	}
	info->temporary = !stmt.sequence->relpersistence;
	info->on_conflict = TransformOnConflict(stmt.onconflict);
	if (info->max_value <= info->min_value) {
		throw ParserException("MINVALUE (%lld) must be less than MAXVALUE (%lld)", info->min_value, info->max_value);
	}
	if (info->start_value < info->min_value) {
		throw ParserException("START value (%lld) cannot be less than MINVALUE (%lld)", info->start_value,
		                      info->min_value);
	}
	if (info->start_value > info->max_value) {
		throw ParserException("START value (%lld) cannot be greater than MAXVALUE (%lld)", info->start_value,
		                      info->max_value);
	}
	result->info = std::move(info);
	return result;
}